

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

float deqp::gles3::Performance::vectorFloatMedianAbsoluteDeviation<long>
                (vector<long,_std::allocator<long>_> *v)

{
  pointer plVar1;
  pointer plVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> temp;
  vector<float,_std::allocator<float>_> absoluteDeviations;
  _Vector_base<float,_std::allocator<float>_> local_40;
  _Vector_base<float,_std::allocator<float>_> local_28;
  
  fVar6 = vectorFloatMedian<long>(v);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_28,
             (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_40);
  plVar1 = (v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  plVar2 = (v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (lVar4 = 0; lVar4 < (int)((ulong)((long)plVar2 - (long)plVar1) >> 3); lVar4 = lVar4 + 1) {
    fVar7 = (float)plVar1[lVar4] - fVar6;
    uVar5 = -(uint)(-fVar7 <= fVar7);
    local_28._M_impl.super__Vector_impl_data._M_start[lVar4] =
         (float)(~uVar5 & (uint)-fVar7 | (uint)fVar7 & uVar5);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_40,
             (vector<float,_std::allocator<float>_> *)&local_28);
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_40._M_impl.super__Vector_impl_data._M_start,
             local_40._M_impl.super__Vector_impl_data._M_finish);
  uVar3 = (ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_40._M_impl.super__Vector_impl_data._M_start >> 2) >> 1;
  if (((long)local_40._M_impl.super__Vector_impl_data._M_finish -
       (long)local_40._M_impl.super__Vector_impl_data._M_start & 4U) == 0) {
    fVar6 = (local_40._M_impl.super__Vector_impl_data._M_start[uVar3 - 1] +
            local_40._M_impl.super__Vector_impl_data._M_start[uVar3]) * 0.5;
  }
  else {
    fVar6 = local_40._M_impl.super__Vector_impl_data._M_start[uVar3];
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_40);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_28);
  return fVar6;
}

Assistant:

static float vectorFloatMedianAbsoluteDeviation (const vector<T>& v)
{
	float			median				= vectorFloatMedian(v);
	vector<float>	absoluteDeviations	(v.size());

	for (int i = 0; i < (int)v.size(); i++)
		absoluteDeviations[i] = deFloatAbs((float)v[i] - median);

	return vectorFloatMedian(absoluteDeviations);
}